

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

void sb_bmp_mask_init(void)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    bmp_basic_mask[lVar1] = 0x80 >> ((byte)lVar1 & 0x1f);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
      bmp_2d_mask[lVar1][lVar2] = '\0';
      if ((ulong)(lVar2 + lVar1) < 9 && lVar2 != 0) {
        bVar3 = 0;
        for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
          bVar3 = bVar3 | bmp_basic_mask[lVar1 + lVar4];
        }
        bmp_2d_mask[lVar1][lVar2] = bVar3;
      }
    }
  }
  return;
}

Assistant:

void sb_bmp_mask_init()
{
    // preset masks to speed up bitmap set/clear operations
    size_t i, pos, len;
    for (i=0; i<8; ++i) {
        bmp_basic_mask[i] = 0x1 << (7-i);
    }
    for (pos=0; pos<8; ++pos) {
        for (len=0; len<9; ++len) {
            bmp_2d_mask[pos][len] = 0x0;
            if (len != 0 && pos+len <= 8) {
                for (i=0; i<len; ++i) {
                    bmp_2d_mask[pos][len] |= bmp_basic_mask[pos+i];
                }
            }
        }
    }
}